

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O0

void __thiscall
htmlcxx2::HTML::Node::Node
          (Node *this,string *tagName,string *text,string *closingText,size_t offset,size_t length,
          Kind kind)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  size_t length_local;
  size_t offset_local;
  string *closingText_local;
  string *text_local;
  string *tagName_local;
  Node *this_local;
  
  impl::toLower<std::__cxx11::string>(&this->tagName_,(impl *)tagName,text);
  std::__cxx11::string::string((string *)&this->text_,(string *)text);
  impl::toLower<std::__cxx11::string>(&this->closingText_,(impl *)closingText,s);
  this->offset_ = offset;
  this->length_ = length;
  this->kind_ = kind;
  memset(&this->attributeKeys_,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->attributeKeys_);
  memset(&this->attributeValues_,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->attributeValues_);
  this->attributesParsed_ = false;
  return;
}

Assistant:

Node(const std::string &tagName,
            const std::string &text,
            const std::string &closingText,
            size_t offset,
            size_t length,
            Kind kind) :
        tagName_(impl::toLower(tagName)),
        text_(text),
        closingText_(impl::toLower(closingText)),
        offset_(offset),
        length_(length),
        kind_(kind),
        attributeKeys_(),
        attributeValues_(),
        attributesParsed_(false) { }